

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O0

int __thiscall
glcts::GeometryShader_gl_PointSize_ValueTest::init
          (GeometryShader_gl_PointSize_ValueTest *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextType type;
  GLuint GVar2;
  deUint32 dVar3;
  int extraout_EAX;
  NotSupportedError *pNVar4;
  RenderContext *pRVar5;
  GLfloat extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  MessageBuilder local_1c0;
  ApiType local_3c;
  undefined1 local_38 [4];
  float local_34;
  GLfloat point_size_range [2];
  Functions *gl;
  GeometryShader_gl_PointSize_ValueTest *this_local;
  
  TestCaseBase::init(&this->super_TestCaseBase,ctx);
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 1) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x382);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((this->super_TestCaseBase).m_is_geometry_shader_point_size_supported & 1U) != 1) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"Geometry shader point size functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x387);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  point_size_range[0] = (GLfloat)(*pRVar5->_vptr_RenderContext[3])();
  point_size_range[1] = extraout_var;
  memset(local_38,0,8);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  local_3c.m_bits = (*pRVar5->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES((ContextType)local_3c.m_bits);
  if (bVar1) {
    (**(code **)((long)point_size_range + 0x818))(0x846d,local_38);
  }
  else {
    (**(code **)((long)point_size_range + 0x818))(0xb12,local_38);
  }
  if (local_34 < 8.0) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1c0,
                        (char (*) [88])
                        "Test requires a minimum maximum point size of 8, implementation reports a maximum of : "
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_34);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"Not supported point size","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x39f);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES(type);
  if (!bVar1) {
    (**(code **)((long)point_size_range + 0x5e0))(0x8642);
  }
  GVar2 = (**(code **)((long)point_size_range + 0x3c8))();
  this->m_program_object_id = GVar2;
  GVar2 = (**(code **)((long)point_size_range + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar2;
  GVar2 = (**(code **)((long)point_size_range + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_geometry_shader_id = GVar2;
  GVar2 = (**(code **)((long)point_size_range + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar2;
  dVar3 = (**(code **)((long)point_size_range + 0x800))();
  glu::checkError(dVar3,"Failed to create program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x3ae);
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_program_object_id,this->m_fragment_shader_id,
                     1,&m_fragment_shader_code,this->m_geometry_shader_id,1,&m_geometry_shader_code,
                     this->m_vertex_shader_id,1,&m_vertex_shader_code,(bool *)0x0);
  if (!bVar1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Could not create program from valid vertex/geometry/fragment shader",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x3b6);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)((long)point_size_range + 0x6f8))(1,&this->m_color_texture_id);
  (**(code **)((long)point_size_range + 0x6d0))(1,&this->m_framebuffer_object_id);
  dVar3 = (**(code **)((long)point_size_range + 0x800))();
  glu::checkError(dVar3,"Could not create framebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x3bd);
  bVar1 = TestCaseBase::setupFramebufferWithTextureAsAttachment
                    (&this->super_TestCaseBase,this->m_framebuffer_object_id,
                     this->m_color_texture_id,0x8058,0x10,0x10);
  if (!bVar1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Failed to setup framebuffer",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x3c2);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)((long)point_size_range + 0x708))(1,&this->m_vertex_array_object_id);
  (**(code **)((long)point_size_range + 0xd8))(this->m_vertex_array_object_id);
  dVar3 = (**(code **)((long)point_size_range + 0x800))();
  glu::checkError(dVar3,"Could not create vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x3c9);
  return extraout_EAX;
}

Assistant:

void GeometryShader_gl_PointSize_ValueTest::init()
{
	/* Initialize Base */
	TestCaseBase::init();

	/* This test should only run if EXT_geometry_shader and EXT_geometry_point_size both are supported */
	if (true != m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	if (true != m_is_geometry_shader_point_size_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_POINT_SIZE_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Verify that point size range is supported */
	glw::GLfloat point_size_range[2] = { 0 };

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		gl.getFloatv(GL_POINT_SIZE_RANGE, point_size_range);
	}
	else
	{
		gl.getFloatv(GL_ALIASED_POINT_SIZE_RANGE, point_size_range);
	}

	if (8.0f > point_size_range[1])
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Test requires a minimum maximum point size of 8, implementation reports a maximum of : "
						   << point_size_range[1] << tcu::TestLog::EndMessage;

		throw tcu::NotSupportedError("Not supported point size", "", __FILE__, __LINE__);
	}

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		gl.enable(GL_PROGRAM_POINT_SIZE);
	}

	/* Create program and shaders */
	m_program_object_id = gl.createProgram();

	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create program");

	/* Build program */
	if (false == buildProgram(m_program_object_id, m_fragment_shader_id, 1 /* fragment shader parts number */,
							  &m_fragment_shader_code, m_geometry_shader_id, 1 /* geometry shader parts number */,
							  &m_geometry_shader_code, m_vertex_shader_id, 1 /* vertex shader parts number */,
							  &m_vertex_shader_code))
	{
		TCU_FAIL("Could not create program from valid vertex/geometry/fragment shader");
	}

	/* Set up texture object and a FBO */
	gl.genTextures(1, &m_color_texture_id);
	gl.genFramebuffers(1, &m_framebuffer_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create framebuffer");

	if (false == setupFramebufferWithTextureAsAttachment(m_framebuffer_object_id, m_color_texture_id, GL_RGBA8,
														 m_texture_width, m_texture_height))
	{
		TCU_FAIL("Failed to setup framebuffer");
	}

	/* Set up a vertex array object */
	gl.genVertexArrays(1, &m_vertex_array_object_id);
	gl.bindVertexArray(m_vertex_array_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");
}